

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.h
# Opt level: O2

void __thiscall
rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
ParseNull<1u,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>,LottieParserImpl>
          (GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
           *this,GenericInsituStringStream<rapidjson::UTF8<char>_> *is,LottieParserImpl *handler)

{
  Ch *pCVar1;
  Ch *pCVar2;
  
  pCVar1 = is->src_;
  pCVar2 = pCVar1 + 1;
  is->src_ = pCVar2;
  if (pCVar1[1] == 'u') {
    pCVar2 = pCVar1 + 2;
    is->src_ = pCVar2;
    if (pCVar1[2] == 'l') {
      pCVar2 = pCVar1 + 3;
      is->src_ = pCVar2;
      if (pCVar1[3] == 'l') {
        is->src_ = pCVar1 + 4;
        (handler->super_LookaheadParserHandler).st_ = kHasNull;
        (handler->super_LookaheadParserHandler).v_.data_.n = (Number)0x0;
        (handler->super_LookaheadParserHandler).v_.data_.s.str = (Ch *)0x0;
        return;
      }
    }
  }
  pCVar1 = is->head_;
  (this->parseResult_).code_ = kParseErrorValueInvalid;
  (this->parseResult_).offset_ = (long)pCVar2 - (long)pCVar1;
  return;
}

Assistant:

Ch Take() { return *src_++; }